

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 in_RCX;
  int iVar6;
  _List_node_base *p_Var7;
  char *pcVar8;
  _Self __tmp;
  _List_node_base *p_Var9;
  size_t i;
  ulong uVar10;
  bool debug;
  uint local_318;
  uint local_314;
  _List_node_base *local_310;
  string tmp;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c_word;
  string local_2c8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream fout;
  
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "                                    _             \tVersion : ");
  poVar5 = std::operator<<(poVar5,(string *)&str_ver_abi_cxx11_);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&std::cout,"   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n");
  std::operator<<((ostream *)&std::cout,
                  "   \\\\()//    / __| \'__| | | | \'_ \\| __/ _ \\| \'__|\tDeveloper : KonstantIMP\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n"
                 );
  std::operator<<((ostream *)&std::cout,"  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n");
  std::operator<<((ostream *)&std::cout,
                  "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n"
                 );
  iVar6 = 0;
  if (argc != 1) {
    debug = false;
    std::ofstream::ofstream(&fout);
    c_word.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&c_word;
    c_word.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    local_310 = (_List_node_base *)&s_name;
    s_name.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    bVar1 = true;
    local_318 = 0;
    local_314 = 0;
    c_word.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         c_word.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    s_name.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = local_310;
    s_name.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = local_310;
    for (iVar6 = 1; iVar6 < argc; iVar6 = iVar6 + 1) {
      pcVar8 = argv[iVar6];
      if (*pcVar8 == '-') {
        if ((pcVar8[1] == 'h') && (pcVar8[2] == '\0')) {
          poVar5 = std::operator<<((ostream *)&std::cout,"CRYPTOR : version ");
          poVar5 = std::operator<<(poVar5,(string *)&str_ver_abi_cxx11_);
          std::operator<<(poVar5,"\n\n");
          std::operator<<((ostream *)&std::cout,
                          "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n");
          std::operator<<((ostream *)&std::cout,"HELP MANUAL :\n");
          std::operator<<((ostream *)&std::cout,"\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n");
          std::operator<<((ostream *)&std::cout,"[OPTIONS]\n");
          std::operator<<((ostream *)&std::cout,"\t-d\tView debug output\n");
          std::operator<<((ostream *)&std::cout,"\t-v\tView version and exit\n");
          std::operator<<((ostream *)&std::cout,"\t-h\tView help message and exit\n");
          std::operator<<((ostream *)&std::cout,"\t-a\tView (en/de)crypt algorithm and exit\n");
          std::operator<<((ostream *)&std::cout,"\t-t\tDon\'t ask about stings names\n");
          std::operator<<((ostream *)&std::cout,"\t-o [F]\tSet output file\n\n");
          std::operator<<((ostream *)&std::cout,"\t-m [M]\tSet output strings style\n");
          std::operator<<((ostream *)&std::cout,"\t[STRING STYLE MODES]\n");
          std::operator<<((ostream *)&std::cout,"\t\tC\tUse c-style strings\n");
          pcVar8 = "\t\tCPP\tUse cpp STL strings\n";
LAB_0010310d:
          std::operator<<((ostream *)&std::cout,pcVar8);
          goto LAB_00103119;
        }
        if ((pcVar8[1] == 'v') && (pcVar8[2] == '\0')) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Version is : ");
          poVar5 = std::operator<<(poVar5,(string *)&str_ver_abi_cxx11_);
          std::operator<<(poVar5,'\n');
          goto LAB_00103119;
        }
        if ((pcVar8[1] == 'd') && (pcVar8[2] == '\0')) {
          debug = true;
        }
        else {
          if ((pcVar8[1] == 'a') && (pcVar8[2] == '\0')) {
            std::operator<<((ostream *)&std::cout,"Encrytion & Decryption algorithm :\n\n");
            std::operator<<((ostream *)&std::cout,
                            "[DESCRIPTION] As an argument we get a text message in the form of a string :\n"
                           );
            std::operator<<((ostream *)&std::cout,"\t\tstring text_msg = \"Hello, World!\"\n\n");
            std::operator<<((ostream *)&std::cout,
                            "[DESCRIPTION] By definition string is a characters array\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 0] = \'H\'\t [ 7] = \'W\'\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 1] = \'e\'\t [ 8] = \'o\'\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 2] = \'l\'\t [ 9] = \'r\'\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 3] = \'l\'\t [10] = \'l\'\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 4] = \'o\'\t [11] = \'d\'\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 5] = \',\'\t [12] = \'!\'\n");
            std::operator<<((ostream *)&std::cout,"\t\t[ 6] = \' \'\n\n");
            std::operator<<((ostream *)&std::cout,
                            "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n"
                           );
            std::operator<<((ostream *)&std::cout,
                            "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n"
                           );
            std::operator<<((ostream *)&std::cout,"\t\tunsigned char a, b;\n\n");
            std::operator<<((ostream *)&std::cout,
                            "[DESCRIPTION] The following actions are performed for each character\n"
                           );
            std::operator<<((ostream *)&std::cout,"\t\ta = b = text_msg[n]\n");
            std::operator<<((ostream *)&std::cout,"\t\ta = a << 4\n");
            std::operator<<((ostream *)&std::cout,"\t\tb = b >> 4\n");
            std::operator<<((ostream *)&std::cout,"\t\ta = b = ~(a | b) - 1\n");
            std::operator<<((ostream *)&std::cout,"\t\ta = a << 4\n");
            std::operator<<((ostream *)&std::cout,"\t\tb = b >> 4\n");
            std::operator<<((ostream *)&std::cout,"\t\tresult = a | b\n\n");
            pcVar8 = 
            "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n"
            ;
            goto LAB_0010310d;
          }
          if ((pcVar8[1] == 't') && (pcVar8[2] == '\0')) {
            bVar1 = false;
          }
          else if ((pcVar8[1] == 'm') && (pcVar8[2] == '\0')) {
            pcVar8 = argv[(long)iVar6 + 1];
            if ((*pcVar8 == 'C') && (pcVar8[1] == '\0')) {
              local_314 = 0;
              iVar6 = iVar6 + 1;
            }
            else {
              iVar3 = strcmp(pcVar8,"CPP");
              in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
              local_314 = (uint)in_RCX;
              iVar6 = iVar6 + 1;
              if (iVar3 != 0) {
                std::operator<<((ostream *)&std::cout,"[ERROR] Incorrect string style mode\n");
                iVar6 = 1;
                goto LAB_0010311b;
              }
            }
          }
          else {
            if ((pcVar8[1] != 'o') || (pcVar8[2] != '\0')) goto LAB_001027eb;
            if ((local_318 & 1) != 0) {
              std::operator<<((ostream *)&std::cout,"You can use only one output file\n");
              iVar6 = 2;
              goto LAB_0010311b;
            }
            std::ofstream::open((char *)&fout,(_Ios_Openmode)argv[(long)iVar6 + 1]);
            iVar6 = iVar6 + 1;
            cVar2 = std::__basic_file<char>::is_open();
            in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
            local_318 = (uint)in_RCX;
            if (cVar2 == '\0') {
              std::operator<<((ostream *)&std::cout,"Can\'t create or open output file\n");
            }
          }
        }
      }
      else {
LAB_001027eb:
        std::__cxx11::string::string((string *)&tmp,pcVar8,(allocator *)&local_2c8);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&c_word,&tmp);
        std::__cxx11::string::~string((string *)&tmp);
      }
    }
    if (debug == true) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Debug output is ON\n\n");
    }
    if ((debug & 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&std::clog,"[DEBUG] String mode : ");
      pcVar8 = "C\n\n";
      if ((local_314 & 1) != 0) {
        pcVar8 = "CPP\n\n";
      }
      std::operator<<(poVar5,pcVar8);
    }
    if ((debug & 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&std::clog,"[DEBUG] Output to file is ");
      pcVar8 = "OFF\n\n";
      if ((local_318 & 1) != 0) {
        pcVar8 = "ON\n\n";
      }
      std::operator<<(poVar5,pcVar8);
    }
    if ((debug & 1U) != 0) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Words analisys\n");
      p_Var7 = (_List_node_base *)&c_word;
      while (p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var7 != (_List_node_base *)&c_word) {
        std::__cxx11::string::string((string *)&tmp,(string *)(p_Var7 + 1));
        poVar5 = std::operator<<((ostream *)&std::clog,'\t');
        poVar5 = std::operator<<(poVar5,(string *)&tmp);
        std::operator<<(poVar5,'\n');
        std::__cxx11::string::~string((string *)&tmp);
      }
    }
    if (bVar1) {
      while( true ) {
        std::operator<<((ostream *)&std::cout,"\nDo you want to set names for strings[y/n] : ");
        uVar4 = _getch();
        if ((char)uVar4 == ' ') break;
        if ((uVar4 & 0xff) == 0x6e) goto LAB_00102a99;
        if ((uVar4 & 0xff) == 0x79) break;
        std::operator<<((ostream *)&std::cout,"Incorrect Answer! Try again!\n\n");
      }
    }
    p_Var7 = c_word.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (bVar1) {
      std::__cxx11::string::string((string *)&tmp,"",(allocator *)&local_2c8);
      for (uVar10 = 0;
          uVar10 < c_word.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size; uVar10 = uVar10 + 1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\nEnter name for ");
        poVar5 = std::operator<<(poVar5,(string *)(p_Var7 + 1));
        std::operator<<(poVar5," : ");
        std::operator>>((istream *)&std::cin,(string *)&tmp);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&s_name,&tmp);
        p_Var7 = p_Var7->_M_next;
      }
      std::__cxx11::string::~string((string *)&tmp);
    }
    else {
LAB_00102a99:
      for (uVar10 = 0;
          uVar10 < c_word.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size; uVar10 = uVar10 + 1) {
        std::__cxx11::to_string(&local_2c8,uVar10);
        std::operator+(&tmp,"str",&local_2c8);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&s_name,&tmp);
        std::__cxx11::string::~string((string *)&tmp);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    if (debug == true) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Starting crypt\n\n");
    }
    p_Var7 = (_List_node_base *)&c_word;
    while (p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)&c_word) {
      cryptor::crypt((cryptor *)&tmp,(char *)(p_Var7 + 1),&debug);
      std::__cxx11::string::operator=((string *)(p_Var7 + 1),(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
    }
    if (debug != false) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Crypt result\n");
    }
    std::__cxx11::string::string((string *)&tmp,"",(allocator *)&local_2c8);
    p_Var7 = (_List_node_base *)&c_word;
    uVar10 = 0;
    while (uVar10 < c_word.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size) {
      local_310 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_310->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var7 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      poVar5 = std::operator<<((ostream *)&std::clog,'\t');
      uVar10 = uVar10 + 1;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"th - ");
      if ((local_314 & 1) == 0) {
        std::operator+(&local_290,"char ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_310 + 1));
        std::operator+(&local_2c8,&local_290,"[] = {");
        std::__cxx11::string::operator=((string *)&tmp,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_290);
        for (p_Var9 = (_List_node_base *)0x0; p_Var9 < p_Var7[1]._M_prev;
            p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1)) {
          if (p_Var9 == (_List_node_base *)((long)&p_Var7[1]._M_prev[-1]._M_prev + 7)) {
            pcVar8 = (char *)std::__cxx11::string::at((ulong)(p_Var7 + 1));
            std::__cxx11::to_string(&local_290,(int)*pcVar8);
            std::operator+(&local_2c8,&local_290,", 0 };");
            std::__cxx11::string::append((string *)&tmp);
          }
          else {
            pcVar8 = (char *)std::__cxx11::string::at((ulong)(p_Var7 + 1));
            std::__cxx11::to_string(&local_290,(int)*pcVar8);
            std::operator+(&local_2c8,&local_290,", ");
            std::__cxx11::string::append((string *)&tmp);
          }
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_290);
        }
      }
      else {
        std::operator+(&local_270,"std::string ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_310 + 1));
        std::operator+(&local_250,&local_270," = \"");
        std::operator+(&local_290,&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1));
        std::operator+(&local_2c8,&local_290,"\";");
        std::__cxx11::string::operator=((string *)&tmp,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_270);
      }
      poVar5 = std::operator<<((ostream *)&std::clog,(string *)&tmp);
      std::operator<<(poVar5,'\n');
      if ((local_318 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&fout,(string *)&tmp);
        std::operator<<(poVar5,'\n');
      }
    }
    if ((local_318 & 1) != 0) {
      std::ofstream::close();
    }
    std::__cxx11::string::~string((string *)&tmp);
LAB_00103119:
    iVar6 = 0;
LAB_0010311b:
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&s_name.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&c_word.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    std::ofstream::~ofstream(&fout);
  }
  return iVar6;
}

Assistant:

int main(int argc, char * argv[]) {
    std::cout << "                                    _             \tVersion : " << str_ver << "\n";
    std::cout << "   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n";
    std::cout << "   \\\\()//    / __| '__| | | | '_ \\| __/ _ \\| '__|\tDeveloper : KonstantIMP\n";
    std::cout << "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n";
    std::cout << "  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n";
    std::cout << "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n";

    if(argc == 1) {
        return 0;
    }

    bool mode = 0;
    bool debug = 0;
    bool f_out = 0;
    bool ask_name = true;

    std::ofstream fout;

    std::list<std::string> c_word;
    std::list<std::string> s_name;

    for(int i{1}; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0) {
            std::cout << "CRYPTOR : version " << str_ver << "\n\n";

            std::cout << "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n";

            std::cout << "HELP MANUAL :\n";
            std::cout << "\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n";

            std::cout << "[OPTIONS]\n";
            std::cout << "\t-d\tView debug output\n";
            std::cout << "\t-v\tView version and exit\n";
            std::cout << "\t-h\tView help message and exit\n";
            std::cout << "\t-a\tView (en/de)crypt algorithm and exit\n";
            std::cout << "\t-t\tDon't ask about stings names\n";

            std::cout << "\t-o [F]\tSet output file\n\n";

            std::cout << "\t-m [M]\tSet output strings style\n";

            std::cout << "\t[STRING STYLE MODES]\n";
            std::cout << "\t\tC\tUse c-style strings\n";
            std::cout << "\t\tCPP\tUse cpp STL strings\n";

            return 0;
        }
        if(strcmp(argv[i], "-v") == 0) {
            std::cout << "Version is : " << str_ver << '\n';
            return 0;
        }
        if(strcmp(argv[i], "-d") == 0) {
            debug = true; continue;
        }
        if(strcmp(argv[i], "-a") == 0) {
            std::cout << "Encrytion & Decryption algorithm :\n\n";

            std::cout << "[DESCRIPTION] As an argument we get a text message in the form of a string :\n";
            std::cout << "\t\tstring text_msg = \"Hello, World!\"\n\n";

            std::cout << "[DESCRIPTION] By definition string is a characters array\n";
            std::cout << "\t\t[ 0] = 'H'\t [ 7] = 'W'\n";
            std::cout << "\t\t[ 1] = 'e'\t [ 8] = 'o'\n";
            std::cout << "\t\t[ 2] = 'l'\t [ 9] = 'r'\n";
            std::cout << "\t\t[ 3] = 'l'\t [10] = 'l'\n";
            std::cout << "\t\t[ 4] = 'o'\t [11] = 'd'\n";
            std::cout << "\t\t[ 5] = ','\t [12] = '!'\n";
            std::cout << "\t\t[ 6] = ' '\n\n";

            std::cout << "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n";

            std::cout << "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n";
            std::cout << "\t\tunsigned char a, b;\n\n";

            std::cout << "[DESCRIPTION] The following actions are performed for each character\n";
            std::cout << "\t\ta = b = text_msg[n]\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\ta = b = ~(a | b) - 1\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\tresult = a | b\n\n";

            std::cout << "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n";

            return 0;
        }
        if(strcmp(argv[i], "-t") == 0) {
            ask_name = false; continue;
        }
        if(strcmp(argv[i], "-m") == 0) {
            i++;

            if(strcmp(argv[i], "C") == 0) mode = 0;
            else if(strcmp(argv[i], "CPP") == 0) mode = 1;
            else {
                std::cout << "[ERROR] Incorrect string style mode\n";
                return 1;
            }

            continue;
        }
        if(strcmp(argv[i], "-o") == 0) {
            if(f_out) {
                std::cout << "You can use only one output file\n";
                return 2;
            }

            f_out = true; i++;

            fout.open(argv[i], std::ios_base::app);

            if(!fout.is_open()) {
                std::cout << "Can't create or open output file\n";
            }

            continue;
        }

        c_word.push_back(argv[i]);
    }

    if(debug) std::clog << "[DEBUG] Debug output is ON\n\n";

    if(debug) std::clog << "[DEBUG] String mode : " << (mode ? "CPP\n\n" : "C\n\n");

    if(debug) std::clog << "[DEBUG] Output to file is " << (f_out ? "ON\n\n" : "OFF\n\n");

    if(debug) {
        std::clog << "[DEBUG] Words analisys\n";

        for(auto iter : c_word) std::clog << '\t' << iter << '\n';
    }

    if(ask_name) {
        bool set = false; char ans = 0;

        do {
            std::cout << "\nDo you want to set names for strings[y/n] : ";
            ans = static_cast<char>(_getch());

            if(ans == 'n') {
                ask_name = false;
                set = true;
            }
            else if(ans == 'y' || ans == ' ') set = true;
            else std::cout << "Incorrect Answer! Try again!\n\n";
        } while(set == false);
    }

    if(ask_name) {
        auto iter = c_word.begin();

        std::string tmp = "";

        for(std::size_t i{0}; i < c_word.size(); i++) {
            std::cout << "\nEnter name for " << *iter << " : ";
            std::cin >> tmp;

            s_name.push_back(tmp);

            iter++;
        }
    }
    else {
        for(std::size_t i{0}; i < c_word.size(); i++) s_name.push_back("str" + std::to_string(i));

        std::cout << "\n";
    }

    if(debug) std::clog << "[DEBUG] Starting crypt\n\n";

    for(auto & iter : c_word) iter = cryptor::crypt(iter, debug);

    if(debug) std::clog << "[DEBUG] Crypt result\n";

    std::string tmp = ""; auto iter = c_word.begin();
    auto name_iter = s_name.begin();

    for(std::size_t i{0}; i < c_word.size(); i++) {
        std::clog << '\t' << i + 1 << "th - ";

        if(mode) {
            tmp = "std::string " + *name_iter + " = \"" + *iter + "\";";
        }
        else {
            tmp = "char " + *name_iter + "[] = {";

            for(std::size_t j{0}; j < (*iter).length(); j++) {
                if(j != ((*iter).length() - 1)) tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", ";
                else tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", 0 };";
            }
        }

        std::clog << tmp << '\n';

        if(f_out) fout << tmp << '\n';

        iter++; name_iter++;
    }

    if(f_out) fout.close();

	return 0;
}